

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<float>_>::PrepareZ
          (TPZMatrix<Fad<float>_> *this,TPZFMatrix<Fad<float>_> *y,TPZFMatrix<Fad<float>_> *z,
          Fad<float> *beta,int opt)

{
  float fVar1;
  long lVar2;
  Fad<float> *pFVar3;
  long col;
  long lVar4;
  size_t sVar5;
  int64_t i;
  long lVar6;
  long row;
  Fad<float> local_50;
  
  lVar2 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar6 = (y->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar2,lVar6);
  col = 0;
  lVar4 = lVar2;
  if (lVar2 < 1) {
    lVar4 = col;
  }
  if (lVar6 < 1) {
    lVar6 = col;
  }
  for (; col != lVar6; col = col + 1) {
    pFVar3 = TPZFMatrix<Fad<float>_>::operator()(z,0,col);
    local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
    local_50.dx_.num_elts = 0;
    local_50.dx_.ptr_to_data = (float *)0x0;
    local_50.defaultVal = 0.0;
    fVar1 = beta->val_;
    Fad<float>::~Fad(&local_50);
    if ((fVar1 != 0.0) || (sVar5 = lVar2 << 5, NAN(fVar1))) {
      if (z != y) {
        memcpy(pFVar3,y->fElem + (y->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow * col,
               lVar2 << 5);
      }
      for (row = 0; lVar4 != row; row = row + 1) {
        pFVar3 = TPZFMatrix<Fad<float>_>::operator()(z,row,col);
        Fad<float>::operator*=<float,_nullptr>(pFVar3,beta);
      }
    }
    else {
      for (; sVar5 != 0; sVar5 = sVar5 - 0x20) {
        local_50._0_8_ = 0;
        Fad<float>::operator=<double,_nullptr>(pFVar3,(double *)&local_50);
        pFVar3 = pFVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}